

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManWindow2(Sbl_Man_t *p,int iPivot)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *pVStack_48;
  int Count;
  Vec_Int_t *vAnds;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vRoots;
  abctime clk;
  Sbl_Man_t *pSStack_18;
  int iPivot_local;
  Sbl_Man_t *p_local;
  
  clk._4_4_ = iPivot;
  pSStack_18 = p;
  vRoots = (Vec_Int_t *)Abc_Clock();
  iVar1 = Gia_ManComputeOneWin
                    (pSStack_18->pGia,clk._4_4_,&vNodes,&vLeaves,&vAnds,&stack0xffffffffffffffb8);
  aVar2 = Abc_Clock();
  pSStack_18->timeWin = (aVar2 - (long)vRoots) + pSStack_18->timeWin;
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    Vec_IntClear(pSStack_18->vRoots);
    Vec_IntAppend(pSStack_18->vRoots,vNodes);
    Vec_IntClear(pSStack_18->vNodes);
    Vec_IntAppend(pSStack_18->vNodes,vLeaves);
    Vec_IntClear(pSStack_18->vLeaves);
    Vec_IntAppend(pSStack_18->vLeaves,vAnds);
    Vec_IntClear(pSStack_18->vAnds);
    Vec_IntAppend(pSStack_18->vAnds,pVStack_48);
    p_local._4_4_ = iVar1;
  }
  return p_local._4_4_;
}

Assistant:

int Sbl_ManWindow2( Sbl_Man_t * p, int iPivot )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vRoots, * vNodes, * vLeaves, * vAnds;
    int Count = Gia_ManComputeOneWin( p->pGia, iPivot, &vRoots, &vNodes, &vLeaves, &vAnds );
    p->timeWin += Abc_Clock() - clk;
    if ( Count == 0 )
        return 0;
    Vec_IntClear( p->vRoots );   Vec_IntAppend( p->vRoots,  vRoots );
    Vec_IntClear( p->vNodes );   Vec_IntAppend( p->vNodes,  vNodes );
    Vec_IntClear( p->vLeaves );  Vec_IntAppend( p->vLeaves, vLeaves );
    Vec_IntClear( p->vAnds );    Vec_IntAppend( p->vAnds,   vAnds );
//Vec_IntPrint( vRoots );
//Vec_IntPrint( vAnds );
//Vec_IntPrint( vLeaves );
    // recompute internal nodes
//    Gia_ManIncrementTravId( p->pGia );
//    Gia_ManCollectAnds( p->pGia, Vec_IntArray(p->vRoots), Vec_IntSize(p->vRoots), p->vAnds, p->vLeaves );
    return Count;
}